

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

idx_t __thiscall duckdb::ColumnReader::FileOffset(ColumnReader *this)

{
  _ColumnMetaData__isset _Var1;
  ColumnChunk *pCVar2;
  ulong uVar3;
  runtime_error *this_00;
  ulong uVar4;
  
  pCVar2 = this->chunk;
  if (pCVar2 != (ColumnChunk *)0x0) {
    _Var1 = (pCVar2->meta_data).__isset;
    if (((byte)_Var1 & 4) == 0) {
      uVar4 = 0xffffffffffffffff;
    }
    else {
      uVar4 = (pCVar2->meta_data).dictionary_page_offset;
    }
    if ((((byte)_Var1 & 2) != 0) && (uVar3 = (pCVar2->meta_data).index_page_offset, uVar3 <= uVar4))
    {
      uVar4 = uVar3;
    }
    uVar3 = (pCVar2->meta_data).data_page_offset;
    if (uVar4 < uVar3) {
      uVar3 = uVar4;
    }
    return uVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"FileOffset called on ColumnReader with no chunk");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

idx_t ColumnReader::FileOffset() const {
	if (!chunk) {
		throw std::runtime_error("FileOffset called on ColumnReader with no chunk");
	}
	auto min_offset = NumericLimits<idx_t>::Maximum();
	if (chunk->meta_data.__isset.dictionary_page_offset) {
		min_offset = MinValue<idx_t>(min_offset, chunk->meta_data.dictionary_page_offset);
	}
	if (chunk->meta_data.__isset.index_page_offset) {
		min_offset = MinValue<idx_t>(min_offset, chunk->meta_data.index_page_offset);
	}
	min_offset = MinValue<idx_t>(min_offset, chunk->meta_data.data_page_offset);

	return min_offset;
}